

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void EvpathProvideWriterDataToReader
               (CP_Services Svcs,DP_RS_Stream RS_Stream_v,int writerCohortSize,
               CP_PeerCohort PeerCohort,void **providedWriterInfo_v)

{
  void *pvVar1;
  char *pcVar2;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  int i;
  EvpathWriterContactInfo *providedWriterInfo;
  Evpath_RS_Stream RS_Stream;
  int local_3c;
  
  *(undefined8 *)(in_RSI + 0x48) = in_RCX;
  *(int *)(in_RSI + 0x44) = in_EDX;
  pvVar1 = malloc((long)in_EDX << 4);
  *(void **)(in_RSI + 0x50) = pvVar1;
  for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
    pcVar2 = strdup((char *)**(undefined8 **)(in_R8 + (long)local_3c * 8));
    *(char **)(*(long *)(in_RSI + 0x50) + (long)local_3c * 0x10) = pcVar2;
    *(undefined8 *)(*(long *)(in_RSI + 0x50) + (long)local_3c * 0x10 + 8) =
         *(undefined8 *)(*(long *)(in_R8 + (long)local_3c * 8) + 8);
    (*(code *)*in_RDI)(*(undefined8 *)(in_RSI + 8),5,
                       "Received contact info \"%s\", WS_stream %p for WSR Rank %d\n",
                       *(undefined8 *)(*(long *)(in_RSI + 0x50) + (long)local_3c * 0x10),
                       *(undefined8 *)(*(long *)(in_RSI + 0x50) + (long)local_3c * 0x10 + 8),
                       local_3c);
  }
  return;
}

Assistant:

static void EvpathProvideWriterDataToReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v,
                                            int writerCohortSize, CP_PeerCohort PeerCohort,
                                            void **providedWriterInfo_v)
{
    Evpath_RS_Stream RS_Stream = (Evpath_RS_Stream)RS_Stream_v;
    EvpathWriterContactInfo *providedWriterInfo = (EvpathWriterContactInfo *)providedWriterInfo_v;

    RS_Stream->PeerCohort = PeerCohort;
    RS_Stream->WriterCohortSize = writerCohortSize;

    /*
     * make a copy of writer contact information (original will not be
     * preserved)
     */
    RS_Stream->WriterContactInfo =
        malloc(sizeof(struct _EvpathWriterContactInfo) * writerCohortSize);
    for (int i = 0; i < writerCohortSize; i++)
    {
        RS_Stream->WriterContactInfo[i].ContactString =
            strdup(providedWriterInfo[i]->ContactString);
        RS_Stream->WriterContactInfo[i].WS_Stream = providedWriterInfo[i]->WS_Stream;
        Svcs->verbose(RS_Stream->CP_Stream, DPTraceVerbose,
                      "Received contact info \"%s\", WS_stream %p for WSR Rank %d\n",
                      RS_Stream->WriterContactInfo[i].ContactString,
                      RS_Stream->WriterContactInfo[i].WS_Stream, i);
    }
}